

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::DoubleRange::ByteSizeLong(DoubleRange *this)

{
  int iVar1;
  double dVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  DoubleRange *this_local;
  
  sStack_18 = 0;
  dVar2 = minvalue(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    sStack_18 = 9;
  }
  dVar2 = maxvalue(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    sStack_18 = sStack_18 + 9;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t DoubleRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DoubleRange)
  size_t total_size = 0;

  // double minValue = 1;
  if (this->minvalue() != 0) {
    total_size += 1 + 8;
  }

  // double maxValue = 2;
  if (this->maxvalue() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}